

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

void compute_literal_bits(char *pattern,int *lbp,int *lbmp)

{
  byte bVar1;
  uint local_2c;
  uint local_28;
  int literal_bits_mask;
  int literal_bits;
  int i;
  int *lbmp_local;
  int *lbp_local;
  char *pattern_local;
  
  local_28 = 0;
  local_2c = 0;
  for (literal_bits_mask = 0; literal_bits_mask < 0x10; literal_bits_mask = literal_bits_mask + 1) {
    bVar1 = (byte)literal_bits_mask;
    if (pattern[0xf - literal_bits_mask] == '0') {
      local_2c = 1 << (bVar1 & 0x1f) | local_2c;
    }
    else if (pattern[0xf - literal_bits_mask] == '1') {
      local_2c = 1 << (bVar1 & 0x1f) | local_2c;
      local_28 = 1 << (bVar1 & 0x1f) | local_28;
    }
  }
  *lbp = local_28;
  *lbmp = local_2c;
  return;
}

Assistant:

static void
compute_literal_bits (const char *pattern, int *lbp, int *lbmp)
{
  int i;
  int literal_bits = 0, literal_bits_mask = 0;

  for (i = 0; i < 16; i++)
    {
      if (pattern[15 - i] == '0')
	literal_bits_mask |= 1 << i;
      else if (pattern[15 - i] == '1')
	{
	  literal_bits_mask |= 1 << i;
	  literal_bits |= 1 << i;
	}
    }

  *lbp = literal_bits;
  *lbmp = literal_bits_mask;
}